

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O3

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,string *text)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  bool bVar10;
  long *local_70;
  long local_68;
  long local_60 [2];
  cmDocumentationFormatter *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = this->TextWidth;
  local_40 = this->TextIndent;
  local_50 = this;
  if (local_38 <= local_40) {
    __assert_fail("this->TextIndent < this->TextWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                  ,0x7d,
                  "void cmDocumentationFormatter::PrintColumn(std::ostream &, const std::string &) const"
                 );
  }
  pbVar8 = (byte *)(text->_M_dataplus)._M_p;
  pbVar7 = pbVar8;
  if (pbVar8 != (byte *)0x0) {
    while ((uVar4 = (ulong)*pbVar7, 0x20 < uVar4 || ((0x100000401U >> (uVar4 & 0x3f) & 1) == 0))) {
      pbVar7 = pbVar7 + 1;
    }
    if (*pbVar8 != 0) {
      uVar6 = CONCAT71((int7)((ulong)this >> 8),1);
      bVar10 = false;
      lVar9 = 0;
      do {
        bVar3 = (byte)uVar4;
        lVar5 = (long)pbVar7 - (long)pbVar8;
        if (lVar5 < (long)(local_38 - (local_40 + lVar9 + (ulong)bVar10))) {
          if (pbVar8 < pbVar7) {
            local_48 = uVar6;
            if (lVar9 == 0) {
              if (local_50->TextIndent == 0 || (uVar6 & 1) != 0) {
                lVar9 = 0;
              }
              else {
                local_70 = local_60;
                std::__cxx11::string::_M_construct((ulong)&local_70,(char)local_50->TextIndent);
                std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
                if (local_70 != local_60) {
                  operator_delete(local_70,local_60[0] + 1);
                }
                lVar9 = 0;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"RPATH_REMOVE could not remove RPATH from file: \n  " +
                            (ulong)(bVar10 ^ 1) + 0x30,2 - (ulong)(bVar10 ^ 1));
              lVar9 = lVar9 + (ulong)bVar10 + 1;
            }
            std::ostream::write((char *)os,(long)pbVar8);
            bVar3 = *pbVar7;
            bVar10 = pbVar7[-1] == 0x2e;
            uVar6 = local_48;
          }
          if (bVar3 == 10) {
            local_70 = (long *)CONCAT71(local_70._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
            pbVar7 = pbVar7 + 1;
            uVar6 = 0;
            lVar5 = 0;
          }
          else {
            lVar5 = lVar5 + lVar9;
          }
        }
        else {
          local_70 = (long *)CONCAT71(local_70._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_70,1);
          if (pbVar8 < pbVar7) {
            local_70 = local_60;
            std::__cxx11::string::_M_construct((ulong)&local_70,(char)local_50->TextIndent);
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
            std::ostream::write((char *)os,(long)pbVar8);
            bVar10 = pbVar7[-1] == 0x2e;
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            lVar5 = 0;
          }
        }
        pbVar8 = pbVar7 + -1;
        do {
          bVar3 = pbVar8[1];
          pbVar8 = pbVar8 + 1;
          pbVar7 = pbVar8;
          bVar2 = bVar3;
        } while (bVar3 == 0x20);
        while ((uVar4 = (ulong)bVar2, 0x20 < bVar2 || ((0x100000401U >> (uVar4 & 0x3f) & 1) == 0)))
        {
          pbVar1 = pbVar7 + 1;
          pbVar7 = pbVar7 + 1;
          bVar2 = *pbVar1;
        }
        lVar9 = lVar5;
      } while (bVar3 != 0);
    }
    return;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                ,0x1a,"const char *(anonymous namespace)::skipToSpace(const char *)");
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os,
                                           std::string const& text) const
{
  // Print text arranged in an indented column of fixed width.
  bool newSentence = false;
  bool firstLine = true;

  assert(this->TextIndent < this->TextWidth);
  const std::ptrdiff_t width = this->TextWidth - this->TextIndent;
  std::ptrdiff_t column = 0;

  // Loop until the end of the text.
  for (const char *l = text.c_str(), *r = skipToSpace(text.c_str()); *l;
       l = skipSpaces(r), r = skipToSpace(l)) {
    // Does it fit on this line?
    if (r - l < width - column - std::ptrdiff_t(newSentence)) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          os << &("  "[std::size_t(!newSentence)]);
          column += 1u + std::ptrdiff_t(newSentence);
        } else if (!firstLine && this->TextIndent) {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << std::string(this->TextIndent, ' ');
        }

        // Print the word.
        os.write(l, r - l);
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << '\n';
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += r - l;
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << '\n';
      firstLine = false;
      if (r > l) {
        os << std::string(this->TextIndent, ' ');
        os.write(l, r - l);
        column = r - l;
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }
    // Move to beginning of next word.  Skip over whitespace.
  }
}